

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint,HelicsError *err)

{
  EndpointObject *pEVar1;
  Message *pMVar2;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if ((pEVar1 != (EndpointObject *)0x0) && (pEVar1->fed != (FedObject *)0x0)) {
    pMVar2 = helics::MessageHolder::newMessage(&pEVar1->fed->messages);
    return pMVar2;
  }
  return (HelicsMessage)0x0;
}

Assistant:

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return nullptr;
    }
    if (endObj->fed == nullptr) {
        return nullptr;
    }
    return endObj->fed->messages.newMessage();
}